

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall
pstore::file::system_error::system_error
          (system_error *this,error_code code,czstring user_message,string *path)

{
  error_code __ec;
  char *local_90;
  char *local_68;
  string local_60;
  ulong local_40;
  error_category *local_38;
  string *local_30;
  string *path_local;
  czstring user_message_local;
  system_error *this_local;
  error_code code_local;
  
  local_38 = code._M_cat;
  this_local._0_4_ = code._M_value;
  *(undefined ***)this = &PTR__system_error_0029baa8;
  local_40 = CONCAT44(this_local._4_4_,(int)this_local);
  local_90 = user_message;
  if (user_message == (czstring)0x0) {
    local_90 = "File";
  }
  local_68 = local_90;
  local_30 = path;
  path_local = (string *)user_message;
  user_message_local = (czstring)this;
  code_local._0_8_ = local_38;
  message<char_const*>(&local_60,this,&local_68,path);
  __ec._0_8_ = local_40 & 0xffffffff;
  __ec._M_cat = local_38;
  std::system_error::system_error(&this->super_system_error,__ec,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  *(undefined ***)this = &PTR__system_error_0029baa8;
  std::__cxx11::string::string((string *)&this->path_,(string *)path);
  return;
}

Assistant:

system_error::system_error (std::error_code const code, gsl::czstring const user_message,
                                    std::string path)
                : std::system_error (
                      code, message (user_message != nullptr ? user_message : "File", path))
                , path_ (std::move (path)) {}